

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O2

int aec_encode(aec_stream *strm,int flush)

{
  internal_state *piVar1;
  uint8_t *puVar2;
  int iVar3;
  long lVar4;
  
  piVar1 = strm->state;
  piVar1->flush = flush;
  strm->total_in = strm->total_in + strm->avail_in;
  strm->total_out = strm->total_out + strm->avail_out;
  do {
    iVar3 = (*piVar1->mode)(strm);
  } while (iVar3 == 1);
  if (piVar1->direct_out != 0) {
    puVar2 = piVar1->cds;
    lVar4 = (long)((int)puVar2 - (int)strm->next_out);
    strm->next_out = strm->next_out + lVar4;
    strm->avail_out = strm->avail_out - lVar4;
    piVar1->cds_buf[0] = *puVar2;
    piVar1->cds = piVar1->cds_buf;
    piVar1->direct_out = 0;
  }
  strm->total_in = strm->total_in - strm->avail_in;
  strm->total_out = strm->total_out - strm->avail_out;
  return 0;
}

Assistant:

int aec_encode(struct aec_stream *strm, int flush)
{
    /**
       Finite-state machine implementation of the adaptive entropy
       encoder.
    */
    int n;
    struct internal_state *state = strm->state;

    state->flush = flush;
    strm->total_in += strm->avail_in;
    strm->total_out += strm->avail_out;

    while (state->mode(strm) == M_CONTINUE);

    if (state->direct_out) {
        n = (int)(state->cds - strm->next_out);
        strm->next_out += n;
        strm->avail_out -= n;

        *state->cds_buf = *state->cds;
        state->cds = state->cds_buf;
        state->direct_out = 0;
    }
    strm->total_in -= strm->avail_in;
    strm->total_out -= strm->avail_out;
    return AEC_OK;
}